

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_exact_to_inexact(sexp ctx,sexp self,sexp_sint_t n,sexp i)

{
  sexp psVar1;
  sexp_sint_t n_00;
  sexp_sint_t n_01;
  double f;
  sexp local_40;
  sexp_gc_var_t local_38;
  
  local_40 = i;
  if (((ulong)i & 1) != 0) {
    f = (double)((long)i >> 1);
    goto LAB_0012993f;
  }
  if (((ulong)i & 2) != 0) {
switchD_0012992b_default:
    psVar1 = sexp_type_exception(ctx,self,2,i);
    return psVar1;
  }
  switch(i->tag) {
  case 0xb:
    return i;
  case 0xc:
    f = sexp_bignum_to_double(i);
    break;
  case 0xd:
    f = sexp_ratio_to_double(ctx,i);
    break;
  case 0xe:
    local_38.var = &local_40;
    local_38.next = (ctx->value).context.saves;
    (ctx->value).context.saves = &local_38;
    local_40 = sexp_make_complex(ctx,(sexp)&DAT_00000001,(sexp)&DAT_00000001);
    psVar1 = sexp_exact_to_inexact(ctx,self,n_00,(i->value).type.name);
    (local_40->value).type.name = psVar1;
    psVar1 = sexp_exact_to_inexact(ctx,self,n_01,(i->value).type.cpl);
    (local_40->value).type.cpl = psVar1;
    (ctx->value).context.saves = local_38.next;
    return local_40;
  default:
    goto switchD_0012992b_default;
  }
LAB_0012993f:
  psVar1 = sexp_make_flonum(ctx,f);
  return psVar1;
}

Assistant:

sexp sexp_exact_to_inexact (sexp ctx, sexp self, sexp_sint_t n, sexp i) {
  sexp_gc_var1(res);
  res = i;
  if (sexp_fixnump(i))
    res = sexp_fixnum_to_flonum(ctx, i);
#if SEXP_USE_FLONUMS
  else if (sexp_flonump(i))
    res = i;
#endif
#if SEXP_USE_BIGNUMS
  else if (sexp_bignump(i))
    res = sexp_make_flonum(ctx, sexp_bignum_to_double(i));
#endif
#if SEXP_USE_RATIOS
  else if (sexp_ratiop(i))
    res = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, i));
#endif
#if SEXP_USE_COMPLEX
  else if (sexp_complexp(i)) {
    sexp_gc_preserve1(ctx, res);
    res = sexp_make_complex(ctx, SEXP_ZERO, SEXP_ZERO);
    sexp_complex_real(res) = sexp_exact_to_inexact(ctx, self, 1, sexp_complex_real(i));
    sexp_complex_imag(res) = sexp_exact_to_inexact(ctx, self, 1, sexp_complex_imag(i));
    sexp_gc_release1(ctx);
  }
#endif
  else
    res = sexp_type_exception(ctx, self, SEXP_FIXNUM, i);
  return res;
}